

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  cmExecutionStatus *pcVar1;
  char *__s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_128;
  long *local_108;
  undefined8 local_100;
  long local_f8 [2];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  long *local_48;
  long **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  pcVar1 = this->Status;
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  __s = this->Name;
  local_b0.first._M_len = strlen(__s);
  local_b0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98 = 0xe;
  local_90 = " cannot find \"";
  local_88 = 0;
  local_78 = (fromFile->_M_dataplus)._M_p;
  local_80 = fromFile->_M_string_length;
  local_70 = 0;
  local_68 = 3;
  local_60 = "\": ";
  local_58 = 0;
  local_50 = local_100;
  local_48 = local_108;
  local_d8 = local_d0;
  local_e8 = 0;
  local_e0 = 1;
  local_d0[0] = 0x2e;
  local_38 = 1;
  local_28 = 0;
  views._M_len = 6;
  views._M_array = &local_b0;
  local_b0.first._M_str = __s;
  local_40 = &local_108;
  local_30 = local_d8;
  cmCatViews(&local_128,views);
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  this->Status.SetError(cmStrCat(this->Name, " cannot find \"", fromFile,
                                 "\": ", cmSystemTools::GetLastSystemError(),
                                 '.'));
  return false;
}